

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

SourceContextInfo * __thiscall
Js::ScriptContext::CreateSourceContextInfo
          (ScriptContext *this,DWORD_PTR sourceContext,char16 *url,size_t len,
          SimpleDataCacheWrapper *dataCacheWrapper,char16 *sourceMapUrl,size_t sourceMapUrlLen)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  SourceContextInfo *pSVar4;
  undefined4 *puVar5;
  Recycler *alloc;
  char16 *pcVar6;
  SourceDynamicProfileManager *pSVar7;
  CriticalSection *this_00;
  Type *addr;
  undefined1 local_80 [8];
  TrackAllocData data;
  DWORD_PTR sourceContext_local;
  SourceContextInfo *local_40;
  SourceContextInfo *sourceContextInfo;
  
  this_00 = &this->threadContext->csFunctionBody;
  data._32_8_ = sourceContext;
  sourceContextInfo = (SourceContextInfo *)dataCacheWrapper;
  CCLock::Enter(&this_00->super_CCLock);
  EnsureSourceContextInfoMap(this);
  pSVar4 = GetSourceContextInfo(this,sourceContext,(SimpleDataCacheWrapper *)sourceContextInfo);
  if (pSVar4 != (SourceContextInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xbe4,
                                "(this->GetSourceContextInfo(sourceContext, dataCacheWrapper) == nullptr)"
                                ,
                                "this->GetSourceContextInfo(sourceContext, dataCacheWrapper) == nullptr"
                               );
    if (!bVar2) goto LAB_0078bc0d;
    *puVar5 = 0;
  }
  local_80 = (undefined1  [8])&SourceContextInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2d7f97f;
  data.filename._0_4_ = 0xbe5;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_80);
  pSVar4 = (SourceContextInfo *)new<Memory::Recycler>(0x38,alloc,0x56b216);
  (pSVar4->sourceDynamicProfileManager).ptr = (SourceDynamicProfileManager *)0x0;
  local_40 = pSVar4;
  uVar3 = GetNextSourceContextId(this);
  pSVar4->sourceContextId = uVar3;
  pSVar4->dwHostSourceContext = sourceContext;
  pSVar4->isHostDynamicDocument = false;
  (pSVar4->sourceDynamicProfileManager).ptr = (SourceDynamicProfileManager *)0x0;
  if (url != (char16 *)0x0) {
    pcVar6 = CopyString(url,len,&this->sourceCodeAllocator);
    (pSVar4->field_5).field_0.url = pcVar6;
  }
  if (sourceMapUrlLen != 0 && sourceMapUrl != (char16 *)0x0) {
    pcVar6 = CopyString(sourceMapUrl,sourceMapUrlLen,&this->sourceCodeAllocator);
    (pSVar4->field_5).field_0.sourceMapUrl = pcVar6;
  }
  if (this->startupComplete == false) {
    pSVar7 = SourceDynamicProfileManager::LoadFromDynamicProfileStorage
                       (pSVar4,this,(SimpleDataCacheWrapper *)sourceContextInfo);
    addr = &pSVar4->sourceDynamicProfileManager;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pSVar7;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    if (addr->ptr == (SourceDynamicProfileManager *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0xbfb,
                                  "(sourceContextInfo->sourceDynamicProfileManager != __null)",
                                  "sourceContextInfo->sourceDynamicProfileManager != NULL");
      if (!bVar2) {
LAB_0078bc0d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  JsUtil::
  BaseDictionary<unsigned_long,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<unsigned_long,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<unsigned_long,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)(((this->super_ScriptContextBase).javascriptLibrary)->cache).sourceContextInfoMap.
                ptr,(unsigned_long *)&data.line,&local_40);
  pSVar4 = local_40;
  CCLock::Leave(&this_00->super_CCLock);
  return pSVar4;
}

Assistant:

SourceContextInfo * ScriptContext::CreateSourceContextInfo(DWORD_PTR sourceContext, char16 const * url, size_t len,
        SimpleDataCacheWrapper* dataCacheWrapper, char16 const * sourceMapUrl /*= NULL*/, size_t sourceMapUrlLen /*= 0*/)
    {
        // Take etw rundown lock on this thread context. We are going to init/add to sourceContextInfoMap.
        AutoCriticalSection autocs(GetThreadContext()->GetFunctionBodyLock());

        EnsureSourceContextInfoMap();
        Assert(this->GetSourceContextInfo(sourceContext, dataCacheWrapper) == nullptr);
        SourceContextInfo * sourceContextInfo = RecyclerNewStructZ(this->GetRecycler(), SourceContextInfo);
        sourceContextInfo->sourceContextId = this->GetNextSourceContextId();
        sourceContextInfo->dwHostSourceContext = sourceContext;
        sourceContextInfo->isHostDynamicDocument = false;
#if ENABLE_PROFILE_INFO
        sourceContextInfo->sourceDynamicProfileManager = nullptr;
#endif

        if (url != nullptr)
        {
            sourceContextInfo->url = CopyString(url, len, this->SourceCodeAllocator());
            JS_ETW(EtwTrace::LogSourceModuleLoadEvent(this, sourceContext, url));
        }
        if (sourceMapUrl != nullptr && sourceMapUrlLen != 0)
        {
            sourceContextInfo->sourceMapUrl = CopyString(sourceMapUrl, sourceMapUrlLen, this->SourceCodeAllocator());
        }

#if ENABLE_PROFILE_INFO
        if (!this->startupComplete)
        {
            sourceContextInfo->sourceDynamicProfileManager = SourceDynamicProfileManager::LoadFromDynamicProfileStorage(sourceContextInfo, this, dataCacheWrapper);
            Assert(sourceContextInfo->sourceDynamicProfileManager != NULL);
        }

        this->Cache()->sourceContextInfoMap->Add(sourceContext, sourceContextInfo);
#endif
        return sourceContextInfo;
    }